

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_geodesic.cpp
# Opt level: O2

array<geometrycentral::Vector2,_3UL> * __thiscall
geometrycentral::surface::anon_unknown_2::vertexCoordinatesInTriangle
          (array<geometrycentral::Vector2,_3UL> *__return_storage_ptr__,anon_unknown_2 *this,
          IntrinsicGeometryInterface *geom,Face face)

{
  double *pdVar1;
  long lVar2;
  _List_node_base *p_Var3;
  unsigned_long uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  Vector2 VVar7;
  
  __return_storage_ptr__->_M_elems[0].x = 0.0;
  __return_storage_ptr__->_M_elems[0].y = 0.0;
  lVar2 = *(long *)(this + 0x5c8);
  p_Var3 = (&((geom->super_BaseGeometryInterface).faceIndices.deleteCallbackIt._M_node)->_M_next)
           [(long)face.
                  super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
                  .mesh];
  pdVar1 = (double *)(lVar2 + (long)p_Var3 * 0x10);
  dVar6 = pdVar1[1];
  __return_storage_ptr__->_M_elems[1].x = *pdVar1;
  __return_storage_ptr__->_M_elems[1].y = dVar6;
  uVar4 = (geom->super_BaseGeometryInterface).cornerIndices.defaultValue;
  auVar5._8_8_ = 0x8000000000000000;
  auVar5._0_8_ = 0x8000000000000000;
  VVar7 = (Vector2)vxorpd_avx512vl(*(undefined1 (*) [16])
                                    (lVar2 + *(long *)(uVar4 + *(long *)(uVar4 + (long)p_Var3 * 8) *
                                                               8) * 0x10),auVar5);
  __return_storage_ptr__->_M_elems[2] = VVar7;
  return __return_storage_ptr__;
}

Assistant:

inline std::array<Vector2, 3> vertexCoordinatesInTriangle(IntrinsicGeometryInterface& geom, Face face) {
  return {Vector2{0., 0.}, geom.halfedgeVectorsInFace[face.halfedge()],
          -geom.halfedgeVectorsInFace[face.halfedge().next().next()]};
}